

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9_hashmap_walk(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  undefined8 *puVar1;
  jx9_hashmap_node *pNode;
  sxi32 sVar2;
  jx9_value *pjVar3;
  jx9_value *pResult;
  int iBool;
  jx9_hashmap_node **ppjVar4;
  uint uVar5;
  jx9_value *local_78;
  jx9_value sKey;
  
  if ((nArg < 2) || (((*apArg)->iFlags & 0x40) == 0)) {
LAB_001323c2:
    iBool = 0;
  }
  else {
    if (nArg == 2) {
      local_78 = (jx9_value *)0x0;
    }
    else {
      local_78 = apArg[2];
    }
    puVar1 = (undefined8 *)((*apArg)->x).pOther;
    jx9MemObjInit((jx9_vm *)*puVar1,&sKey);
    ppjVar4 = (jx9_hashmap_node **)(puVar1 + 2);
    for (uVar5 = 0; uVar5 < *(uint *)((long)puVar1 + 0x2c); uVar5 = uVar5 + 1) {
      pNode = *ppjVar4;
      pjVar3 = HashmapExtractNodeValue(pNode);
      if (pjVar3 != (jx9_value *)0x0) {
        jx9HashmapExtractNodeKey(pNode,&sKey);
        sVar2 = jx9VmCallUserFunctionAp((jx9_vm *)*puVar1,apArg[1],pResult,pjVar3,&sKey,local_78,0);
        jx9MemObjRelease(&sKey);
        if (sVar2 != 0) goto LAB_001323c2;
      }
      ppjVar4 = &pNode->pPrev;
    }
    iBool = 1;
  }
  jx9_result_bool(pCtx,iBool);
  return 0;
}

Assistant:

static int jx9_hashmap_walk(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_value *pValue, *pUserData, sKey;
	jx9_hashmap_node *pEntry;
	jx9_hashmap *pMap;
	sxi32 rc;
	sxu32 n;
	if( nArg < 2 || !jx9_value_is_json_array(apArg[0]) ){
		/* Invalid/Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	pUserData = nArg > 2 ? apArg[2] : 0;
	/* Point to the internal representation of the input hashmap */
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	jx9MemObjInit(pMap->pVm, &sKey);
	/* Perform the desired operation */
	pEntry = pMap->pFirst;
	for( n = 0 ; n < pMap->nEntry ; n++ ){
		/* Extract the node value */
		pValue = HashmapExtractNodeValue(pEntry);
		if( pValue ){
			/* Extract the entry key */
			jx9HashmapExtractNodeKey(pEntry, &sKey);
			/* Invoke the supplied callback */
			rc = jx9VmCallUserFunctionAp(pMap->pVm, apArg[1], 0, pValue, &sKey, pUserData, 0);
			jx9MemObjRelease(&sKey);
			if( rc != SXRET_OK ){
				/* An error occured while invoking the supplied callback [i.e: not defined] */
				jx9_result_bool(pCtx, 0); /* return FALSE */
				return JX9_OK;
			}
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
	}
	/* All done, return TRUE */
	jx9_result_bool(pCtx, 1);
	return JX9_OK;
}